

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packer.c
# Opt level: O0

int packer_segment_get(uint32_t field,void *value,mixed_segment *segment)

{
  pack_segment_data *data;
  mixed_segment *segment_local;
  void *value_local;
  uint32_t field_local;
  
  if (field == 1) {
    *(bool *)value = segment->mix == mix_noop;
    value_local._4_4_ = 1;
  }
  else if (field == 3) {
    *(undefined4 *)value = *(undefined4 *)((long)segment->data + 0x78);
    value_local._4_4_ = 1;
  }
  else if (field == 4) {
    *(undefined4 *)value = *(undefined4 *)((long)segment->data + 0x7c);
    value_local._4_4_ = 1;
  }
  else {
    mixed_err(7);
    value_local._4_4_ = 0;
  }
  return value_local._4_4_;
}

Assistant:

int packer_segment_get(uint32_t field, void *value, struct mixed_segment *segment){
  struct pack_segment_data *data = (struct pack_segment_data *)segment->data;
  
  switch(field){
  case MIXED_RESAMPLE_TYPE:
    *((int *)value) = data->quality;
    return 1;
  case MIXED_VOLUME:
    *((float *)value) = data->target_volume;
    return 1;
  case MIXED_BYPASS:
    *(bool *)value = (segment->mix == mix_noop);
    return 1;
  default:
    mixed_err(MIXED_INVALID_FIELD);
    return 0;
  }
}